

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

void __thiscall
helics::FederateState::processCommunications(FederateState *this,milliseconds period)

{
  MessageProcessingResult MVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  pthread_t pVar5;
  hash<std::thread::id> local_e9;
  id local_e8;
  ActionMessage treq;
  
  ActionMessage::ActionMessage(&treq,cmd_user_return);
  treq.source_id.gid = (this->global_id)._M_i.gid;
  local_e8._M_thread = pthread_self();
  sVar2 = std::hash<std::thread::id>::operator()(&local_e9,&local_e8);
  treq.messageID = (int32_t)sVar2;
  addAction(this,&treq);
  MVar1 = CONTINUE_PROCESSING;
  lVar3 = std::chrono::_V2::steady_clock::now();
  do {
    if (MVar1 == USER_RETURN) {
      if (9 < period.__r) {
        lVar4 = std::chrono::_V2::steady_clock::now();
        pVar5 = period.__r * 1000000 + (lVar3 - lVar4);
        if (10000000 < (long)pVar5) {
          local_e8._M_thread = pVar5;
          std::this_thread::sleep_for<long,std::ratio<1l,1000000000l>>
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)&local_e8);
          processCommunications(this,(milliseconds)0x0);
        }
      }
      break;
    }
    MVar1 = genericUnspecifiedQueueProcess(this,true);
  } while (MVar1 != BUSY);
  ActionMessage::~ActionMessage(&treq);
  return;
}

Assistant:

void FederateState::processCommunications(std::chrono::milliseconds period)
{
    ActionMessage treq(CMD_USER_RETURN);
    treq.source_id = global_id.load();
    // the user return should only be for this thread, other threads will ignore it
    treq.messageID = static_cast<int32_t>(std::hash<std::thread::id>{}(std::this_thread::get_id()));
    addAction(treq);
    auto starttime = std::chrono::steady_clock::now();
    auto ret = MessageProcessingResult::CONTINUE_PROCESSING;
    while (ret != MessageProcessingResult::USER_RETURN) {
        ret = genericUnspecifiedQueueProcess(true);
        if (ret == MessageProcessingResult::BUSY) {
            return;
        }
    }
    if (period >= std::chrono::milliseconds(10)) {
        auto ctime = std::chrono::steady_clock::now();
        if (period - (ctime - starttime) > std::chrono::milliseconds(10)) {
            std::this_thread::sleep_for(period - (ctime - starttime));
            processCommunications(std::chrono::milliseconds(0));
        }
    }
}